

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_slot.h
# Opt level: O2

unsigned_short __thiscall Am_Constraint_Iterator::Length(Am_Constraint_Iterator *this)

{
  Am_Slot_Data *pAVar1;
  unsigned_short uVar2;
  am_CList *paVar3;
  
  pAVar1 = (this->context).data;
  if (pAVar1 == (Am_Slot_Data *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    for (paVar3 = &pAVar1->constraints; paVar3->head != (CItem *)0x0;
        paVar3 = (am_CList *)&paVar3->head->next) {
      uVar2 = uVar2 + 1;
    }
  }
  return uVar2;
}

Assistant:

operator Am_Slot_Data *() const { return data; }